

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

Token __thiscall flow::lang::Lexer::continueCidr(Lexer *this,size_t range)

{
  uint uVar1;
  Report *pRVar2;
  pointer pcVar3;
  Token TVar4;
  _Alloc_hider _Var5;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  nextChar(this,true);
  uVar1 = this->currentChar_ - 0x30;
  if (uVar1 < 10) {
    this->numberValue_ = 0;
    do {
      this->numberValue_ = (ulong)uVar1 + this->numberValue_ * 10;
      std::__cxx11::string::push_back((char)this + -0x58);
      nextChar(this,true);
      uVar1 = this->currentChar_ - 0x30;
    } while (uVar1 < 10);
    TVar4 = Cidr;
    if (this->numberValue_ <= (long)range) goto LAB_00133f15;
    pRVar2 = this->report_;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"{}[{}:{}]: CIDR prefix out of range.","");
    pcVar3 = (this->location_).filename._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + (this->location_).filename._M_string_length);
    diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long>
              (pRVar2,&this->lastLocation_,&local_80,&local_60,(ulong)(this->location_).end.line,
               (ulong)(this->location_).end.column);
    local_40.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
    _Var5._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_00133ef4;
  }
  else {
    pRVar2 = this->report_;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"{}[{}:{}]: invalid byte {}","");
    pcVar3 = (this->location_).filename._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar3,pcVar3 + (this->location_).filename._M_string_length);
    diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
              (pRVar2,&this->lastLocation_,&local_80,&local_40,(ulong)(this->location_).end.line,
               (ulong)(this->location_).end.column,(uint)(byte)this->currentChar_);
    _Var5._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
LAB_00133ef4:
      operator_delete(_Var5._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  TVar4 = Unknown;
LAB_00133f15:
  this->token_ = TVar4;
  return TVar4;
}

Assistant:

Token Lexer::continueCidr(size_t range) {
  // IPv6 CIDR
  nextChar();  // consume '/'

  if (!std::isdigit(currentChar())) {
    report_.tokenError(lastLocation(),
        "{}[{}:{}]: invalid byte {}",
        location_.filename,
        line(),
        column(),
        (int)(currentChar() & 0xFF));
    return token_ = Token::Unknown;
  }

  numberValue_ = 0;
  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (numberValue_ > static_cast<decltype(numberValue_)>(range)) {
    report_.tokenError(lastLocation(),
                       "{}[{}:{}]: CIDR prefix out of range.",
                       location_.filename, line(), column());
    return token_ = Token::Unknown;
  }

  return token_ = Token::Cidr;
}